

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_ego_min_val(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *name_and_value;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"min_values");
    if (_Var1) {
      pcVar4 = parser_getstr(p,"min_values");
      pcVar4 = string_make(pcVar4);
      name_and_value = strtok(pcVar4," |");
      pVar5 = PARSE_ERROR_NONE;
      while (name_and_value != (char *)0x0) {
        eVar2 = grab_int_value((int16_t *)((long)pvVar3 + 0x140),obj_mods,name_and_value);
        if (eVar2 != 0) {
          pVar5 = PARSE_ERROR_INVALID_VALUE;
          break;
        }
        name_and_value = strtok((char *)0x0," |");
      }
      string_free(pcVar4);
    }
    else {
      pVar5 = PARSE_ERROR_MISSING_FIELD;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_ego_min_val(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	char *s, *t;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "min_values")) {
		return PARSE_ERROR_MISSING_FIELD;
	}

	s = string_make(parser_getstr(p, "min_values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		if (!grab_int_value(e->min_modifiers, obj_mods, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}